

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.h
# Opt level: O1

void __thiscall OpenMPFlushDirective::addFlushList(OpenMPFlushDirective *this,char *_flush_list)

{
  allocator<char> local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,_flush_list,&local_31);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->flush_list,
             &local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void addFlushList (const char* _flush_list) { flush_list.push_back(std::string(_flush_list)); }